

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

void __thiscall CVmImageLoader::load_static_objs(CVmImageLoader *this,ulong siz)

{
  ulong uVar1;
  uint idx;
  uint id;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  uint uVar4;
  ulong siz_00;
  ulong uVar5;
  ulong uVar6;
  char buf [32];
  uint local_58;
  uint local_54;
  
  if (5 < siz) {
    (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_58,6);
    uVar2 = local_54;
    uVar4 = local_58 & 0xffff;
    if ((short)local_58 != 0) {
      idx = local_58 >> 0x10;
      uVar1 = (ulong)(local_54 & 1) * 2 + 6;
      uVar6 = siz - 6;
      do {
        uVar5 = uVar6 - uVar1;
        if (uVar6 < uVar1) goto LAB_002689fe;
        (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_58);
        id = local_58;
        siz_00 = (ulong)(ushort)local_54;
        if ((uVar2 & 1) != 0) {
          siz_00 = (ulong)local_54;
        }
        uVar6 = uVar5 - siz_00;
        if (uVar5 < siz_00) goto LAB_002689fe;
        iVar3 = (*this->fp_->_vptr_CVmImageFile[4])(this->fp_,siz_00,0,uVar5);
        CVmMetaTable::create_from_image
                  (G_meta_table_X,idx,id,(char *)CONCAT44(extraout_var,iVar3),siz_00);
        if ((uVar2 & 2) != 0) {
          *(ushort *)&G_obj_table_X.pages_[id >> 0xc][id & 0xfff].field_0x14 =
               *(ushort *)&G_obj_table_X.pages_[id >> 0xc][id & 0xfff].field_0x14 | 0x80;
        }
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    return;
  }
LAB_002689fe:
  err_throw(0x132);
}

Assistant:

void CVmImageLoader::read_data(char *buf, size_t read_len,
                               ulong *remaining_size)
{
    /* ensure we have enough data left in our block */
    if (read_len > *remaining_size)
        err_throw(VMERR_IMAGE_BLOCK_TOO_SMALL);

    /* decrement the remaining size counter for the data we just read */
    *remaining_size -= read_len;

    /* read the data */
    fp_->copy_data(buf, read_len);
}